

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLFormatter.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XMLFormatter::XMLFormatter
          (XMLFormatter *this,char *outEncoding,char *docVersion,XMLFormatTarget *target,
          EscapeFlags escapeFlags,UnRepFlags unrepFlags,MemoryManager *manager)

{
  bool bVar1;
  XMLCh *pXVar2;
  XMLTranscoder *pXVar3;
  TranscodingException *this_00;
  undefined1 local_60 [8];
  ArrayJanitor<char16_t> jname;
  XMLCh *tmpDocVer;
  Codes local_34;
  UnRepFlags local_30;
  Codes resCode;
  UnRepFlags unrepFlags_local;
  EscapeFlags escapeFlags_local;
  XMLFormatTarget *target_local;
  char *docVersion_local;
  char *outEncoding_local;
  XMLFormatter *this_local;
  
  local_30 = unrepFlags;
  resCode = escapeFlags;
  _unrepFlags_local = target;
  target_local = (XMLFormatTarget *)docVersion;
  docVersion_local = outEncoding;
  outEncoding_local = (char *)this;
  XMemory::XMemory((XMemory *)this);
  this->fEscapeFlags = resCode;
  this->fOutEncoding = (XMLCh *)0x0;
  this->fTarget = _unrepFlags_local;
  this->fUnRepFlags = local_30;
  this->fXCoder = (XMLTranscoder *)0x0;
  this->fAposRef = (XMLByte *)0x0;
  this->fAposLen = 0;
  this->fAmpRef = (XMLByte *)0x0;
  this->fAmpLen = 0;
  this->fGTRef = (XMLByte *)0x0;
  this->fGTLen = 0;
  this->fLTRef = (XMLByte *)0x0;
  this->fLTLen = 0;
  this->fQuoteRef = (XMLByte *)0x0;
  this->fQuoteLen = 0;
  this->fIsXML11 = false;
  this->fMemoryManager = manager;
  pXVar2 = XMLString::transcode(docVersion_local,this->fMemoryManager);
  this->fOutEncoding = pXVar2;
  pXVar3 = XMLTransService::makeNewTranscoderFor
                     (XMLPlatformUtils::fgTransService,this->fOutEncoding,&local_34,0x4000,
                      this->fMemoryManager);
  this->fXCoder = pXVar3;
  if (this->fXCoder == (XMLTranscoder *)0x0) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fOutEncoding);
    this_00 = (TranscodingException *)__cxa_allocate_exception(0x30);
    TranscodingException::TranscodingException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/framework/XMLFormatter.cpp"
               ,0xbb,Trans_CantCreateCvtrFor,docVersion_local,(char *)0x0,(char *)0x0,(char *)0x0,
               this->fMemoryManager);
    __cxa_throw(this_00,&TranscodingException::typeinfo,TranscodingException::~TranscodingException)
    ;
  }
  jname.fMemoryManager =
       (MemoryManager *)XMLString::transcode((char *)target_local,this->fMemoryManager);
  ArrayJanitor<char16_t>::ArrayJanitor
            ((ArrayJanitor<char16_t> *)local_60,(char16_t *)jname.fMemoryManager,
             this->fMemoryManager);
  bVar1 = XMLString::equals((XMLCh *)jname.fMemoryManager,L"1.1");
  this->fIsXML11 = bVar1;
  ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)local_60);
  return;
}

Assistant:

XMLFormatter::XMLFormatter( const   char* const             outEncoding
                            , const char* const             docVersion
                            ,       XMLFormatTarget* const  target
                            , const EscapeFlags             escapeFlags
                            , const UnRepFlags              unrepFlags
                            ,       MemoryManager* const    manager)
    : fEscapeFlags(escapeFlags)
    , fOutEncoding(0)
    , fTarget(target)
    , fUnRepFlags(unrepFlags)
    , fXCoder(0)
    , fAposRef(0)
    , fAposLen(0)
    , fAmpRef(0)
    , fAmpLen(0)
    , fGTRef(0)
    , fGTLen(0)
    , fLTRef(0)
    , fLTLen(0)
    , fQuoteRef(0)
    , fQuoteLen(0)
    , fIsXML11(false)
    , fMemoryManager(manager)
{
    // Transcode the encoding string
    fOutEncoding = XMLString::transcode(outEncoding, fMemoryManager);

    // Try to create a transcoder for this encoding
    XMLTransService::Codes resCode;
    fXCoder = XMLPlatformUtils::fgTransService->makeNewTranscoderFor
    (
        fOutEncoding
        , resCode
        , kTmpBufSize
        , fMemoryManager
    );

    if (!fXCoder)
    {
        fMemoryManager->deallocate(fOutEncoding); //delete [] fOutEncoding;
        ThrowXMLwithMemMgr1
        (
            TranscodingException
            , XMLExcepts::Trans_CantCreateCvtrFor
            , outEncoding
            , fMemoryManager
        );
    }

    XMLCh* const tmpDocVer = XMLString::transcode(docVersion, fMemoryManager);
    ArrayJanitor<XMLCh> jname(tmpDocVer, fMemoryManager);
    fIsXML11 = XMLString::equals(tmpDocVer, XMLUni::fgVersion1_1);
}